

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O1

iterator __thiscall
nestl::impl::detail::
rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
::erase(rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
        *this,const_iterator position)

{
  size_type *psVar1;
  rb_tree_node_base *prVar2;
  base_ptr prVar3;
  const_iterator cVar4;
  
  prVar3 = (position.m_node)->m_right;
  cVar4.m_node = position.m_node;
  if ((position.m_node)->m_right == (base_ptr)0x0) {
    do {
      prVar3 = cVar4.m_node;
      cVar4.m_node = prVar3->m_parent;
    } while (prVar3 == (cVar4.m_node)->m_right);
    if (prVar3->m_right == cVar4.m_node) {
      cVar4.m_node = prVar3;
    }
  }
  else {
    do {
      cVar4.m_node = prVar3;
      prVar3 = (cVar4.m_node)->m_left;
    } while ((cVar4.m_node)->m_left != (base_ptr)0x0);
  }
  prVar2 = rb_tree_rebalance_for_erase(position.m_node,&(this->m_impl).m_header);
  operator_delete(prVar2);
  psVar1 = &(this->m_impl).m_node_count;
  *psVar1 = *psVar1 - 1;
  return (iterator)cVar4.m_node;
}

Assistant:

iterator
    erase(const_iterator position) NESTL_NOEXCEPT_SPEC
    {
        const_iterator result = position;
        ++result;
        m_erase_aux(position);
        return result.m_const_cast();
    }